

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

char mctools_drive_letter(mcu8str *rawpath)

{
  mcu8str path;
  char *local_28;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  char local_1;
  
  mctools_impl_view_no_winnamespace
            ((mcu8str *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (in_stack_ffffffffffffffe0 < 2) {
    local_1 = '\0';
  }
  else if (local_28[1] == ':') {
    if ((*local_28 < 'A') || ('Z' < *local_28)) {
      if ((*local_28 < 'a') || ('z' < *local_28)) {
        local_1 = '\0';
      }
      else {
        local_1 = *local_28 + -0x20;
      }
    }
    else {
      local_1 = *local_28;
    }
  }
  else {
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

char mctools_drive_letter( const mcu8str* rawpath )
  {
    mcu8str path = mctools_impl_view_no_winnamespace(rawpath);
    if ( path.size < 2 )
      return 0;
    if ( path.c_str[1] != ':' )
      return 0;
    if ( path.c_str[0] >= 'A' && path.c_str[0] <= 'Z' )
      return path.c_str[0];
    if ( path.c_str[0] >= 'a' && path.c_str[0] <= 'z' )
      return (char)(path.c_str[0] - 32);//uppercase
    return 0;
  }